

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall wallet::SQLiteDatabase::Verify(SQLiteDatabase *this,bilingual_str *error)

{
  uint uVar1;
  sqlite3 *psVar2;
  string original;
  string original_00;
  bilingual_str lhs;
  bool bVar3;
  int iVar4;
  optional<int> oVar5;
  CChainParams *pCVar6;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint *in_R8;
  long in_FS_OFFSET;
  undefined8 uStack_178;
  sqlite3_stmt *stmt;
  undefined4 uStack_168;
  int32_t user_ver;
  uint32_t net_magic;
  uint32_t app_id;
  string local_158;
  string local_138 [32];
  bilingual_str local_118;
  string str_msg;
  bilingual_str local_b8;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = this->m_db;
  if (psVar2 == (sqlite3 *)0x0) {
    __assert_fail("m_db",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0xc0,"bool wallet::SQLiteDatabase::Verify(bilingual_str &)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"application_id",(allocator<char> *)&str_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"the application id",(allocator<char> *)&stmt);
  oVar5 = ReadPragmaInteger(psVar2,&local_78.original,&local_b8.original,error);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  if (((ulong)oVar5.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    app_id = oVar5.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_payload;
    pCVar6 = Params();
    uVar1 = *(uint *)(pCVar6->pchMessageStart)._M_elems;
    net_magic = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (net_magic ==
        oVar5.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _M_payload) {
      psVar2 = this->m_db;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"user_version",(allocator<char> *)&str_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"sqlite wallet schema version",(allocator<char> *)&stmt);
      oVar5 = ReadPragmaInteger(psVar2,&local_78.original,&local_b8.original,error);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      if (((ulong)oVar5.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> & 0x100000000) == 0) goto LAB_009d916e;
      user_ver = oVar5.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_payload;
      if (user_ver == 0) {
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stmt;
        stmt = (sqlite3_stmt *)0x0;
        iVar4 = sqlite3_prepare_v2(this->m_db,"PRAGMA integrity_check",0xffffffffffffffff,args,0);
        if (iVar4 == 0) {
          while( true ) {
            iVar4 = sqlite3_step(stmt);
            if (iVar4 != 100) break;
            __s = (char *)sqlite3_column_text(stmt,0);
            if (__s == (char *)0x0) {
              _(&local_b8,(ConstevalStringLiteral)0xe21029);
              str_msg._M_dataplus._M_p = (pointer)sqlite3_errstr(100);
              tinyformat::format<char_const*>
                        (&local_78,(tinyformat *)&local_b8,(bilingual_str *)&str_msg,(char **)args);
              goto LAB_009d93ba;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&str_msg,__s,(allocator<char> *)&local_78);
            bVar3 = std::operator==(&str_msg,"ok");
            if (!bVar3) {
              if ((error->original)._M_string_length == 0) {
                _(&local_118,(ConstevalStringLiteral)0xe21068);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_138,"\n",(allocator<char> *)((long)&uStack_178 + 7));
                original._M_string_length = (size_type)stmt;
                original._M_dataplus._M_p = (pointer)uStack_178;
                original.field_2._M_allocated_capacity._0_4_ = uStack_168;
                original.field_2._M_allocated_capacity._4_4_ = user_ver;
                original.field_2._8_4_ = net_magic;
                original.field_2._12_4_ = app_id;
                Untranslated(&local_b8,original);
                lhs.original._M_string_length = (size_type)stmt;
                lhs.original._M_dataplus._M_p = (pointer)uStack_178;
                lhs.original.field_2._M_allocated_capacity._0_4_ = uStack_168;
                lhs.original.field_2._M_allocated_capacity._4_4_ = user_ver;
                lhs.original.field_2._8_4_ = net_magic;
                lhs.original.field_2._12_4_ = app_id;
                lhs.translated = local_158;
                ::operator+(&local_78,lhs,&local_118);
                bilingual_str::operator=(error,&local_78);
                bilingual_str::~bilingual_str(&local_78);
                bilingual_str::~bilingual_str(&local_b8);
                std::__cxx11::string::~string(local_138);
                bilingual_str::~bilingual_str(&local_118);
              }
              tinyformat::format<std::__cxx11::string>
                        (&local_158,(tinyformat *)0xe6426b,(char *)&str_msg,args);
              original_00._M_string_length = (size_type)stmt;
              original_00._M_dataplus._M_p = (pointer)uStack_178;
              original_00.field_2._M_allocated_capacity._0_4_ = uStack_168;
              original_00.field_2._M_allocated_capacity._4_4_ = user_ver;
              original_00.field_2._8_4_ = net_magic;
              original_00.field_2._12_4_ = app_id;
              Untranslated(&local_78,original_00);
              bilingual_str::operator+=(error,&local_78);
              bilingual_str::~bilingual_str(&local_78);
              std::__cxx11::string::~string((string *)&local_158);
            }
            std::__cxx11::string::~string((string *)&str_msg);
          }
          if (iVar4 != 0x65) {
            _(&local_b8,(ConstevalStringLiteral)0xe20fe6);
            str_msg._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
            tinyformat::format<char_const*>
                      (&local_78,(tinyformat *)&local_b8,(bilingual_str *)&str_msg,(char **)args);
LAB_009d93ba:
            bilingual_str::operator=(error,&local_78);
            bilingual_str::~bilingual_str(&local_78);
            bilingual_str::~bilingual_str(&local_b8);
          }
          sqlite3_finalize(stmt);
          bVar3 = (error->original)._M_string_length == 0;
          goto LAB_009d9170;
        }
        sqlite3_finalize(stmt);
        _(&local_b8,(ConstevalStringLiteral)0xe20fa3);
        str_msg._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
        tinyformat::format<char_const*>
                  (&local_78,(tinyformat *)&local_b8,(bilingual_str *)&str_msg,(char **)args);
      }
      else {
        _(&local_b8,(ConstevalStringLiteral)0xe20f36);
        tinyformat::format<int,int>
                  (&local_78,(tinyformat *)&local_b8,(bilingual_str *)&user_ver,
                   &WALLET_SCHEMA_VERSION,(int *)in_R8);
      }
    }
    else {
      _(&local_b8,(ConstevalStringLiteral)0xe20ecd);
      tinyformat::format<unsigned_int,unsigned_int>
                (&local_78,(tinyformat *)&local_b8,(bilingual_str *)&net_magic,&app_id,in_R8);
    }
    bilingual_str::operator=(error,&local_78);
    bilingual_str::~bilingual_str(&local_78);
    bilingual_str::~bilingual_str(&local_b8);
  }
LAB_009d916e:
  bVar3 = false;
LAB_009d9170:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteDatabase::Verify(bilingual_str& error)
{
    assert(m_db);

    // Check the application ID matches our network magic
    auto read_result = ReadPragmaInteger(m_db, "application_id", "the application id", error);
    if (!read_result.has_value()) return false;
    uint32_t app_id = static_cast<uint32_t>(read_result.value());
    uint32_t net_magic = ReadBE32(Params().MessageStart().data());
    if (app_id != net_magic) {
        error = strprintf(_("SQLiteDatabase: Unexpected application id. Expected %u, got %u"), net_magic, app_id);
        return false;
    }

    // Check our schema version
    read_result = ReadPragmaInteger(m_db, "user_version", "sqlite wallet schema version", error);
    if (!read_result.has_value()) return false;
    int32_t user_ver = read_result.value();
    if (user_ver != WALLET_SCHEMA_VERSION) {
        error = strprintf(_("SQLiteDatabase: Unknown sqlite wallet schema version %d. Only version %d is supported"), user_ver, WALLET_SCHEMA_VERSION);
        return false;
    }

    sqlite3_stmt* stmt{nullptr};
    int ret = sqlite3_prepare_v2(m_db, "PRAGMA integrity_check", -1, &stmt, nullptr);
    if (ret != SQLITE_OK) {
        sqlite3_finalize(stmt);
        error = strprintf(_("SQLiteDatabase: Failed to prepare statement to verify database: %s"), sqlite3_errstr(ret));
        return false;
    }
    while (true) {
        ret = sqlite3_step(stmt);
        if (ret == SQLITE_DONE) {
            break;
        }
        if (ret != SQLITE_ROW) {
            error = strprintf(_("SQLiteDatabase: Failed to execute statement to verify database: %s"), sqlite3_errstr(ret));
            break;
        }
        const char* msg = (const char*)sqlite3_column_text(stmt, 0);
        if (!msg) {
            error = strprintf(_("SQLiteDatabase: Failed to read database verification error: %s"), sqlite3_errstr(ret));
            break;
        }
        std::string str_msg(msg);
        if (str_msg == "ok") {
            continue;
        }
        if (error.empty()) {
            error = _("Failed to verify database") + Untranslated("\n");
        }
        error += Untranslated(strprintf("%s\n", str_msg));
    }
    sqlite3_finalize(stmt);
    return error.empty();
}